

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall FDummyTexture::FDummyTexture(FDummyTexture *this)

{
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_007e6f68;
  (this->super_FTexture).Width = 0x40;
  (this->super_FTexture).Height = 0x40;
  (this->super_FTexture).WidthBits = '\x06';
  (this->super_FTexture).HeightBits = '\x06';
  (this->super_FTexture).WidthMask = 0x3f;
  (this->super_FTexture).UseType = '\r';
  return;
}

Assistant:

FDummyTexture::FDummyTexture ()
{
	Width = 64;
	Height = 64;
	HeightBits = 6;
	WidthBits = 6;
	WidthMask = 63;
	UseType = TEX_Null;
}